

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

bool treatAsAbsolute(QString *path)

{
  QChar c;
  bool bVar1;
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  uint6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  byte bVar2;
  undefined1 in_stack_ffffffffffffff9f;
  byte bVar3;
  QFileSystemEntry *this;
  QChar local_42 [29];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QChar::QChar<char16_t,_true>(local_42,L':');
  c.ucs._1_1_ = in_stack_ffffffffffffff9f;
  c.ucs._0_1_ = in_stack_ffffffffffffff9e;
  bVar1 = QString::contains(&in_RDI->m_filePath,c,
                            CONCAT13(in_stack_ffffffffffffff8f,
                                     CONCAT12(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff8c)))
  ;
  bVar3 = 0;
  bVar2 = 0;
  if (bVar1) {
    QFileInfo::QFileInfo((QFileInfo *)this,(QString *)(ulong)in_stack_ffffffffffffff98);
    bVar3 = 1;
    bVar1 = QFileInfo::isAbsolute((QFileInfo *)0x18fcc2);
    in_stack_ffffffffffffff8f = true;
    if (bVar1) goto LAB_0018fcf1;
  }
  QFileSystemEntry::QFileSystemEntry
            (in_RDI,(QString *)
                    CONCAT17(in_stack_ffffffffffffff8f,
                             CONCAT16(in_stack_ffffffffffffff8e,
                                      CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))
                            ));
  bVar2 = 1;
  in_stack_ffffffffffffff8f = QFileSystemEntry::isAbsolute(this);
LAB_0018fcf1:
  if ((bVar2 & 1) != 0) {
    QFileSystemEntry::~QFileSystemEntry(in_RDI);
  }
  if ((bVar3 & 1) != 0) {
    QFileInfo::~QFileInfo((QFileInfo *)0x18fd21);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)in_stack_ffffffffffffff8f;
}

Assistant:

static bool treatAsAbsolute(const QString &path)
{
    // ### Qt 6: be consistent about absolute paths

    // QFileInfo will use the right FS-engine for virtual file-systems
    // (e.g. resource paths).  Unfortunately, for real file-systems, it relies
    // on QFileSystemEntry's isRelative(), which is flawed on MS-Win, ignoring
    // its (correct) isAbsolute().  So only use that isAbsolute() unless there's
    // a colon in the path.
    // FIXME: relies on virtual file-systems having colons in their prefixes.
    // The case of an MS-absolute C:/... path happens to work either way.
    return (path.contains(u':') && QFileInfo(path).isAbsolute())
        || QFileSystemEntry(path).isAbsolute();
}